

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O2

MaybeResult<wasm::Ok> *
wasm::WATParser::memory<wasm::WATParser::ParseDeclsCtx>
          (MaybeResult<wasm::Ok> *__return_storage_ptr__,ParseDeclsCtx *ctx)

{
  undefined1 uVar1;
  size_t sVar2;
  pointer pcVar3;
  MemType type;
  bool bVar4;
  _Variant_storage<false,_wasm::WATParser::MemType,_wasm::Err> *p_Var5;
  undefined4 *puVar6;
  vector<char,_std::allocator<char>_> *__u;
  string *this;
  ImportNames *import_00;
  ImportNames *exports_00;
  undefined8 uVar7;
  Type addressType;
  string_view expected;
  string_view expected_00;
  string_view expected_01;
  string_view expected_02;
  Name name;
  undefined1 local_1e8 [8];
  Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_> exports;
  string local_1a0;
  string local_180;
  undefined1 local_160 [8];
  MaybeResult<wasm::WATParser::ImportNames> import;
  optional<std::vector<char,_std::allocator<char>_>_> data;
  string local_110 [32];
  uintptr_t local_f0;
  uint64_t uStack_e8;
  unsigned_long local_e0;
  undefined4 uStack_d8;
  undefined4 uStack_d4;
  undefined4 local_d0;
  undefined4 uStack_cc;
  Type local_c8;
  unsigned_long local_c0;
  undefined3 local_b8;
  undefined1 uStack_b5;
  undefined3 uStack_b4;
  undefined4 local_b0;
  undefined3 uStack_ac;
  pointer local_a8;
  Result<std::vector<char,_std::allocator<char>_>_> _val_2;
  uint64_t local_68;
  undefined1 local_60 [8];
  optional<wasm::Name> id;
  undefined1 local_40 [8];
  __index_type local_38;
  
  sVar2 = (ctx->in).pos;
  expected._M_str = "memory";
  expected._M_len = 6;
  bVar4 = Lexer::takeSExprStart(&ctx->in,expected);
  if (!bVar4) {
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\x01';
    return __return_storage_ptr__;
  }
  Lexer::takeID((optional<wasm::Name> *)local_60,&ctx->in);
  if (id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Name>._M_payload._8_1_ == '\0') {
    uVar7 = (char *)0x0;
    local_c8.id = 0;
  }
  else {
    local_c8.id = (uintptr_t)local_60;
    uVar7 = id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
            super__Optional_payload_base<wasm::Name>._M_payload._M_value.super_IString.str._M_len;
  }
  inlineExports((Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_> *)local_1e8,&ctx->in)
  ;
  std::__detail::__variant::
  _Copy_ctor_base<false,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>::
  _Copy_ctor_base((_Copy_ctor_base<false,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>
                   *)local_60,
                  (_Copy_ctor_base<false,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>
                   *)local_1e8);
  if ((bool)local_40[0] == true) {
    std::__cxx11::string::string((string *)&stack0xffffffffffffff60,(string *)local_60);
    std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err>::
    _Variant_storage<2ul,wasm::Err>
              ((_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)__return_storage_ptr__,
               &stack0xffffffffffffff60);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff60);
    std::__detail::__variant::
    _Variant_storage<false,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>::
    ~_Variant_storage((_Variant_storage<false,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>
                       *)local_60);
    goto LAB_00c05b5f;
  }
  std::__detail::__variant::
  _Variant_storage<false,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>::
  ~_Variant_storage((_Variant_storage<false,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>
                     *)local_60);
  inlineImport((MaybeResult<wasm::WATParser::ImportNames> *)local_160,&ctx->in);
  std::__detail::__variant::
  _Copy_ctor_base<false,_wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>::_Copy_ctor_base
            ((_Copy_ctor_base<false,_wasm::WATParser::ImportNames,_wasm::None,_wasm::Err> *)local_60
             ,(_Copy_ctor_base<false,_wasm::WATParser::ImportNames,_wasm::None,_wasm::Err> *)
              local_160);
  if (local_40[0] == '\x02') {
    std::__cxx11::string::string((string *)&stack0xffffffffffffff60,(string *)local_60);
    std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err>::
    _Variant_storage<2ul,wasm::Err>
              ((_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)__return_storage_ptr__,
               &stack0xffffffffffffff60);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff60);
    std::__detail::__variant::
    _Variant_storage<false,_wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::WATParser::ImportNames,_wasm::None,_wasm::Err> *)
               local_60);
  }
  else {
    std::__detail::__variant::
    _Variant_storage<false,_wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::WATParser::ImportNames,_wasm::None,_wasm::Err> *)
               local_60);
    addressType.id = 3;
    expected_00._M_str = "i64";
    expected_00._M_len = 3;
    bVar4 = Lexer::takeKeyword(&ctx->in,expected_00);
    if (!bVar4) {
      expected_01._M_str = "i32";
      expected_01._M_len = 3;
      Lexer::takeKeyword(&ctx->in,expected_01);
      addressType.id = 2;
    }
    expected_02._M_str = "data";
    expected_02._M_len = 4;
    bVar4 = Lexer::takeSExprStart(&ctx->in,expected_02);
    if (bVar4) {
      if (import.val.super__Variant_base<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
          super__Move_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
          super__Copy_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
          super__Move_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>._M_u.
          _24_1_ == '\x01') {
        datastring<wasm::WATParser::ParseDeclsCtx>
                  ((Result<std::vector<char,_std::allocator<char>_>_> *)local_60,ctx);
        std::__detail::__variant::
        _Copy_ctor_base<false,_std::vector<char,_std::allocator<char>_>,_wasm::Err>::_Copy_ctor_base
                  ((_Copy_ctor_base<false,_std::vector<char,_std::allocator<char>_>,_wasm::Err> *)
                   &stack0xffffffffffffff60,
                   (_Copy_ctor_base<false,_std::vector<char,_std::allocator<char>_>,_wasm::Err> *)
                   local_60);
        if (_val_2.val.super__Variant_base<std::vector<char,_std::allocator<char>_>,_wasm::Err>.
            super__Move_assign_alias<std::vector<char>,_wasm::Err>.
            super__Copy_assign_alias<std::vector<char>,_wasm::Err>.
            super__Move_ctor_alias<std::vector<char>,_wasm::Err>.
            super__Copy_ctor_alias<std::vector<char>,_wasm::Err>.
            super__Variant_storage_alias<std::vector<char>,_wasm::Err>._M_u._24_1_ == '\x01') {
          std::__cxx11::string::string(local_110,(string *)&stack0xffffffffffffff60);
          std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err>::
          _Variant_storage<2ul,wasm::Err>
                    ((_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)__return_storage_ptr__
                     ,local_110);
          std::__cxx11::string::~string(local_110);
          std::__detail::__variant::
          _Variant_storage<false,_std::vector<char,_std::allocator<char>_>,_wasm::Err>::
          ~_Variant_storage((_Variant_storage<false,_std::vector<char,_std::allocator<char>_>,_wasm::Err>
                             *)&stack0xffffffffffffff60);
        }
        else {
          std::__detail::__variant::
          _Variant_storage<false,_std::vector<char,_std::allocator<char>_>,_wasm::Err>::
          ~_Variant_storage((_Variant_storage<false,_std::vector<char,_std::allocator<char>_>,_wasm::Err>
                             *)&stack0xffffffffffffff60);
          bVar4 = Lexer::takeRParen(&ctx->in);
          if (bVar4) {
            __u = (vector<char,_std::allocator<char>_> *)0x0;
            if ((bool)local_40[0] == false) {
              __u = (vector<char,_std::allocator<char>_> *)local_60;
            }
            local_a8 = (__u->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                       super__Vector_impl_data._M_start;
            pcVar3 = (__u->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
            std::optional<std::vector<char,std::allocator<char>>>::operator=
                      ((optional<std::vector<char,std::allocator<char>>> *)
                       ((long)&import.val.
                               super__Variant_base<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                               .
                               super__Move_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                               .
                               super__Copy_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                               .
                               super__Move_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                               .
                               super__Copy_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                       + 0x20),__u);
            local_68 = (ulong)(pcVar3 + (0xffff - (long)local_a8)) >> 0x10;
            std::__detail::__variant::
            _Variant_storage<false,_std::vector<char,_std::allocator<char>_>,_wasm::Err>::
            ~_Variant_storage((_Variant_storage<false,_std::vector<char,_std::allocator<char>_>,_wasm::Err>
                               *)local_60);
            local_a8 = (pointer)CONCAT71(local_a8._1_7_,1);
            uVar1 = 0;
            local_60 = (undefined1  [8])addressType.id;
            local_c0 = local_68;
            goto LAB_00c0588a;
          }
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1a0,"expected end of inline data",(allocator<char> *)local_110
                    );
          Lexer::err((Err *)&stack0xffffffffffffff60,&ctx->in,&local_1a0);
          std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err>::
          _Variant_storage<2ul,wasm::Err>
                    ((_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)__return_storage_ptr__
                     ,&stack0xffffffffffffff60);
          std::__cxx11::string::~string((string *)&stack0xffffffffffffff60);
          std::__cxx11::string::~string((string *)&local_1a0);
        }
        std::__detail::__variant::
        _Variant_storage<false,_std::vector<char,_std::allocator<char>_>,_wasm::Err>::
        ~_Variant_storage((_Variant_storage<false,_std::vector<char,_std::allocator<char>_>,_wasm::Err>
                           *)local_60);
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)
                   ((long)&exports.val.
                           super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>
                           .super__Move_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                           super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                           super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
                           super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::Err> + 0x20),
                   "imported memories cannot have inline data",
                   (allocator<char> *)&stack0xffffffffffffff60);
        Lexer::err((Err *)local_60,&ctx->in,
                   (string *)
                   ((long)&exports.val.
                           super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>
                           .super__Move_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                           super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                           super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
                           super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::Err> + 0x20));
        std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err>::
        _Variant_storage<2ul,wasm::Err>
                  ((_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)__return_storage_ptr__,
                   local_60);
        std::__cxx11::string::~string((string *)local_60);
        this = (string *)
               ((long)&exports.val.
                       super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>
                       .super__Move_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                       super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                       super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
                       super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::Err> + 0x20);
LAB_00c059ef:
        std::__cxx11::string::~string((string *)this);
      }
    }
    else {
      memtypeContinued<wasm::WATParser::ParseDeclsCtx>
                ((Result<wasm::WATParser::MemType> *)local_60,ctx,addressType);
      std::__detail::__variant::_Copy_ctor_base<false,_wasm::WATParser::MemType,_wasm::Err>::
      _Copy_ctor_base((_Copy_ctor_base<false,_wasm::WATParser::MemType,_wasm::Err> *)
                      &stack0xffffffffffffff60,
                      (_Copy_ctor_base<false,_wasm::WATParser::MemType,_wasm::Err> *)local_60);
      if (_val_2.val.super__Variant_base<std::vector<char,_std::allocator<char>_>,_wasm::Err>.
          super__Move_assign_alias<std::vector<char>,_wasm::Err>.
          super__Copy_assign_alias<std::vector<char>,_wasm::Err>.
          super__Move_ctor_alias<std::vector<char>,_wasm::Err>.
          super__Copy_ctor_alias<std::vector<char>,_wasm::Err>.
          super__Variant_storage_alias<std::vector<char>,_wasm::Err>._M_index == '\x01') {
        std::__cxx11::string::string(local_110,(string *)&stack0xffffffffffffff60);
        std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err>::
        _Variant_storage<2ul,wasm::Err>
                  ((_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)__return_storage_ptr__,
                   local_110);
        std::__cxx11::string::~string(local_110);
        std::__detail::__variant::_Variant_storage<false,_wasm::WATParser::MemType,_wasm::Err>::
        ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::MemType,_wasm::Err> *)
                          &stack0xffffffffffffff60);
        std::__detail::__variant::_Variant_storage<false,_wasm::WATParser::MemType,_wasm::Err>::
        ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::MemType,_wasm::Err> *)local_60);
      }
      else {
        std::__detail::__variant::_Variant_storage<false,_wasm::WATParser::MemType,_wasm::Err>::
        ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::MemType,_wasm::Err> *)
                          &stack0xffffffffffffff60);
        bVar4 = local_38 == '\0';
        p_Var5 = (_Variant_storage<false,_wasm::WATParser::MemType,_wasm::Err> *)0x0;
        if (bVar4) {
          p_Var5 = (_Variant_storage<false,_wasm::WATParser::MemType,_wasm::Err> *)local_60;
        }
        local_68 = (p_Var5->_M_u)._M_first._M_storage.limits.initial;
        local_c0 = (p_Var5->_M_u)._M_first._M_storage.limits.max.
                   super__Optional_base<unsigned_long,_true,_true>._M_payload.
                   super__Optional_payload_base<unsigned_long>._M_payload._M_value;
        local_a8 = (pointer)CONCAT71(local_a8._1_7_,*(undefined1 *)((long)&p_Var5->_M_u + 0x18));
        puVar6 = (undefined4 *)&DAT_00000019;
        if (bVar4) {
          puVar6 = (undefined4 *)
                   &id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                    super__Optional_payload_base<wasm::Name>.field_0x11;
        }
        local_b8 = (undefined3)*puVar6;
        uStack_b5 = (undefined1)*(undefined4 *)((long)puVar6 + 3);
        uStack_b4 = (undefined3)((uint)*(undefined4 *)((long)puVar6 + 3) >> 8);
        uVar1 = *(undefined1 *)((long)&p_Var5->_M_u + 0x20);
        puVar6 = (undefined4 *)&DAT_00000021;
        if (bVar4) {
          puVar6 = (undefined4 *)((long)local_40 + 1);
        }
        local_b0 = *puVar6;
        uStack_ac = (undefined3)((uint)*(undefined4 *)((long)puVar6 + 3) >> 8);
        std::__detail::__variant::_Variant_storage<false,_wasm::WATParser::MemType,_wasm::Err>::
        ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::MemType,_wasm::Err> *)local_60);
LAB_00c0588a:
        bVar4 = Lexer::takeRParen(&ctx->in);
        if (!bVar4) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_180,"expected end of memory declaration",
                     (allocator<char> *)&stack0xffffffffffffff60);
          Lexer::err((Err *)local_60,&ctx->in,&local_180);
          std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err>::
          _Variant_storage<2ul,wasm::Err>
                    ((_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)__return_storage_ptr__
                     ,local_60);
          std::__cxx11::string::~string((string *)local_60);
          this = &local_180;
          goto LAB_00c059ef;
        }
        exports_00 = (ImportNames *)local_1e8;
        if (exports.val.
            super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>.
            super__Move_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
            super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
            super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
            super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
            super__Variant_storage_alias<std::vector<wasm::Name>,_wasm::Err>._M_u._24_1_ != '\0') {
          exports_00 = (ImportNames *)0x0;
        }
        import_00 = (ImportNames *)local_160;
        if (import.val.super__Variant_base<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
            super__Move_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
            super__Copy_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
            super__Move_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
            super__Copy_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
            super__Variant_storage_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>._M_u.
            _24_1_ != '\0') {
          import_00 = (ImportNames *)0x0;
        }
        uStack_e8 = local_68;
        local_e0 = local_c0;
        uStack_d4 = CONCAT31(uStack_b4,uStack_b5);
        uStack_d8 = CONCAT31((int3)_local_b8,local_a8._0_1_);
        uStack_cc = CONCAT31(uStack_ac,local_b0._3_1_);
        local_d0._1_3_ = (undefined3)local_b0;
        local_d0 = CONCAT31(local_d0._1_3_,uVar1);
        type._36_4_ = uStack_cc;
        type._32_4_ = local_d0;
        type.limits.max.super__Optional_base<unsigned_long,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_long>._12_4_ = uStack_d4;
        type.limits.max.super__Optional_base<unsigned_long,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_long>._8_4_ = uStack_d8;
        type.limits.initial = local_68;
        type.addressType.id = (uintptr_t)local_60;
        type.limits.max.super__Optional_base<unsigned_long,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_long>._M_payload._M_value = local_c0;
        name.super_IString.str._M_str = (char *)uVar7;
        name.super_IString.str._M_len = local_c8.id;
        local_f0 = (uintptr_t)local_60;
        ParseDeclsCtx::addMemory
                  ((Result<wasm::Ok> *)local_60,ctx,name,
                   (vector<wasm::Name,_std::allocator<wasm::Name>_> *)exports_00,import_00,type,
                   (Index)sVar2);
        if ((bool)local_40[0] == true) {
          std::__cxx11::string::string((string *)&stack0xffffffffffffff60,(string *)local_60);
          std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err>::
          _Variant_storage<2ul,wasm::Err>
                    ((_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)__return_storage_ptr__
                     ,&stack0xffffffffffffff60);
          std::__cxx11::string::~string((string *)&stack0xffffffffffffff60);
          std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                    ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_60);
        }
        else {
          std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                    ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_60);
          *(__index_type *)
           ((long)&(__return_storage_ptr__->val).
                   super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\0';
        }
      }
    }
    std::_Optional_payload_base<std::vector<char,_std::allocator<char>_>_>::_M_reset
              ((_Optional_payload_base<std::vector<char,_std::allocator<char>_>_> *)
               ((long)&import.val.
                       super__Variant_base<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                       .
                       super__Copy_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                       .super__Move_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err> +
               0x20));
  }
  std::__detail::__variant::
  _Variant_storage<false,_wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>::~_Variant_storage
            ((_Variant_storage<false,_wasm::WATParser::ImportNames,_wasm::None,_wasm::Err> *)
             local_160);
LAB_00c05b5f:
  std::__detail::__variant::
  _Variant_storage<false,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>::
  ~_Variant_storage((_Variant_storage<false,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>
                     *)local_1e8);
  return __return_storage_ptr__;
}

Assistant:

MaybeResult<> memory(Ctx& ctx) {
  auto pos = ctx.in.getPos();
  if (!ctx.in.takeSExprStart("memory"sv)) {
    return {};
  }

  Name name;
  if (auto id = ctx.in.takeID()) {
    name = *id;
  }

  auto exports = inlineExports(ctx.in);
  CHECK_ERR(exports);

  auto import = inlineImport(ctx.in);
  CHECK_ERR(import);

  auto addressType = Type::i32;
  if (ctx.in.takeKeyword("i64"sv)) {
    addressType = Type::i64;
  } else {
    ctx.in.takeKeyword("i32"sv);
  }

  std::optional<typename Ctx::MemTypeT> mtype;
  std::optional<typename Ctx::DataStringT> data;
  if (ctx.in.takeSExprStart("data"sv)) {
    if (import) {
      return ctx.in.err("imported memories cannot have inline data");
    }
    auto datastr = datastring(ctx);
    CHECK_ERR(datastr);
    if (!ctx.in.takeRParen()) {
      return ctx.in.err("expected end of inline data");
    }
    mtype =
      ctx.makeMemType(addressType, ctx.getLimitsFromData(*datastr), false);
    data = *datastr;
  } else {
    auto type = memtypeContinued(ctx, addressType);
    CHECK_ERR(type);
    mtype = *type;
  }

  if (!ctx.in.takeRParen()) {
    return ctx.in.err("expected end of memory declaration");
  }

  CHECK_ERR(ctx.addMemory(name, *exports, import.getPtr(), *mtype, pos));

  if (data) {
    CHECK_ERR(ctx.addImplicitData(std::move(*data)));
  }

  return Ok{};
}